

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86.cpp
# Opt level: O3

int __thiscall ncnn::ELU_x86::forward_inplace(ELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
    pp_Var2 = this->_vptr_ELU_x86;
    lVar6 = 0;
    do {
      pauVar9 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar7 < 4) {
        uVar5 = 0;
      }
      else {
        fVar10 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        iVar4 = 3;
        do {
          auVar19 = minps(*pauVar9,ZEXT816(0));
          auVar20._8_4_ = 0x42b0c0a5;
          auVar20._0_8_ = 0x42b0c0a542b0c0a5;
          auVar20._12_4_ = 0x42b0c0a5;
          auVar20 = minps(auVar19,auVar20);
          auVar19._8_4_ = 0xc2b0c0a5;
          auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar19._12_4_ = 0xc2b0c0a5;
          auVar20 = maxps(auVar20,auVar19);
          fVar15 = auVar20._0_4_ * 1.442695 + 0.5;
          fVar16 = auVar20._4_4_ * 1.442695 + 0.5;
          fVar17 = auVar20._8_4_ * 1.442695 + 0.5;
          fVar18 = auVar20._12_4_ * 1.442695 + 0.5;
          fVar11 = (float)(int)fVar15;
          fVar12 = (float)(int)fVar16;
          fVar13 = (float)(int)fVar17;
          fVar14 = (float)(int)fVar18;
          fVar11 = fVar11 - (float)(-(uint)(fVar15 < fVar11) & 0x3f800000);
          fVar12 = fVar12 - (float)(-(uint)(fVar16 < fVar12) & 0x3f800000);
          fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
          fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
          fVar15 = fVar11 * -0.6931472 + auVar20._0_4_;
          fVar16 = fVar12 * -0.6931472 + auVar20._4_4_;
          fVar17 = fVar13 * -0.6931472 + auVar20._8_4_;
          fVar18 = fVar14 * -0.6931472 + auVar20._12_4_;
          auVar20 = maxps(*pauVar9,ZEXT816(0));
          *(float *)*pauVar9 =
               ((float)((int)fVar11 * 0x800000 + 0x3f800000) *
                (fVar15 + 1.0 +
                (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                  0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15) + -1.0) *
               fVar10 + auVar20._0_4_;
          *(float *)(*pauVar9 + 4) =
               ((float)((int)fVar12 * 0x800000 + 0x3f800000) *
                (fVar16 + 1.0 +
                (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                  0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + -1.0) *
               fVar10 + auVar20._4_4_;
          *(float *)(*pauVar9 + 8) =
               ((float)((int)fVar13 * 0x800000 + 0x3f800000) *
                (fVar17 + 1.0 +
                (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                  0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + -1.0) *
               fVar10 + auVar20._8_4_;
          *(float *)(*pauVar9 + 0xc) =
               ((float)((int)fVar14 * 0x800000 + 0x3f800000) *
                (fVar18 + 1.0 +
                (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                  0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + -1.0) *
               fVar10 + auVar20._12_4_;
          pauVar9 = pauVar9 + 1;
          iVar4 = iVar4 + 4;
          uVar5 = uVar7 & 0xfffffffc;
        } while (iVar4 < (int)uVar7);
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar8 = 0;
        do {
          if (*(float *)(*pauVar9 + lVar8 * 4) < 0.0) {
            p_Var3 = pp_Var2[-3];
            fVar10 = expf(*(float *)(*pauVar9 + lVar8 * 4));
            *(float *)(*pauVar9 + lVar8 * 4) =
                 (fVar10 + -1.0) * *(float *)(&this->field_0xd0 + (long)p_Var3);
          }
          lVar8 = lVar8 + 1;
        } while (uVar7 - uVar5 != (int)lVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

int ELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}